

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_createcosmetic(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  DESCRIPTOR_DATA *pDVar4;
  AFFECT_DATA *pAVar5;
  char *pcVar6;
  char *in_RSI;
  __type_conflict2 _Var7;
  bool wear;
  bool under;
  int value;
  OBJ_DATA *obj;
  char *wearname;
  char wlname [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffc9b8;
  OBJ_DATA *in_stack_ffffffffffffc9c0;
  CHAR_DATA *in_stack_ffffffffffffc9c8;
  undefined2 in_stack_ffffffffffffc9d0;
  byte bVar8;
  byte bVar9;
  int iVar10;
  char *in_stack_ffffffffffffc9e8;
  int in_stack_ffffffffffffca6c;
  OBJ_INDEX_DATA *in_stack_ffffffffffffca70;
  char *in_stack_ffffffffffffdbc0;
  flag_type *in_stack_ffffffffffffdbc8;
  char local_2418 [4576];
  flag_type *in_stack_ffffffffffffedc8;
  CHAR_DATA *in_stack_ffffffffffffedd0;
  char local_1218 [4616];
  char *local_10;
  
  iVar10 = 0;
  bVar9 = 0;
  bVar8 = 0;
  iVar2 = strcmp(in_RSI,"");
  if (iVar2 == 0) {
    send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
                 in_stack_ffffffffffffc9c8);
    send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
                 in_stack_ffffffffffffc9c8);
    send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
                 in_stack_ffffffffffffc9c8);
    send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
                 in_stack_ffffffffffffc9c8);
    send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
                 in_stack_ffffffffffffc9c8);
    send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
                 in_stack_ffffffffffffc9c8);
    send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
                 in_stack_ffffffffffffc9c8);
  }
  else {
    local_10 = one_argument((char *)in_stack_ffffffffffffc9c0,(char *)in_stack_ffffffffffffc9b8);
    bVar1 = str_cmp(local_1218,"eqlocations");
    if (bVar1) {
      bVar1 = str_cmp(local_1218,"under");
      if (bVar1) {
        bVar1 = str_cmp(local_1218,"wear");
        if (bVar1) {
          if ((bVar8 & 1) != 0) {
            return;
          }
          if ((bVar9 & 1) != 0) {
            return;
          }
          strcpy(&stack0xffffffffffffc9e8,local_1218);
          bVar1 = str_cmp(local_10,"");
          if (!bVar1) {
            return;
          }
        }
        else {
          local_10 = one_argument((char *)in_stack_ffffffffffffc9c0,
                                  (char *)in_stack_ffffffffffffc9b8);
          bVar1 = str_cmp(local_2418,"");
          if (((!bVar1) || (bVar1 = str_cmp(local_10,""), !bVar1)) ||
             (iVar10 = flag_value(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0),
             iVar10 == -99)) {
            send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,
                                                  in_stack_ffffffffffffc9d0))),
                         in_stack_ffffffffffffc9c8);
            return;
          }
          bVar8 = 1;
        }
      }
      else {
        local_10 = one_argument((char *)in_stack_ffffffffffffc9c0,(char *)in_stack_ffffffffffffc9b8)
        ;
        local_10 = one_argument((char *)in_stack_ffffffffffffc9c0,(char *)in_stack_ffffffffffffc9b8)
        ;
        bVar1 = str_cmp(local_2418,"");
        if (((!bVar1) || (bVar1 = str_cmp(&stack0xffffffffffffc9e8,""), !bVar1)) ||
           ((bVar1 = str_cmp(local_10,""), !bVar1 ||
            (iVar10 = flag_value(in_stack_ffffffffffffdbc8,in_stack_ffffffffffffdbc0), iVar10 == -99
            )))) {
          send_to_char((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,
                                                  in_stack_ffffffffffffc9d0))),
                       in_stack_ffffffffffffc9c8);
          return;
        }
        bVar9 = 1;
      }
      get_obj_index((int)((ulong)in_stack_ffffffffffffc9c8 >> 0x20));
      pCVar3 = (CHAR_DATA *)create_object(in_stack_ffffffffffffca70,in_stack_ffffffffffffca6c);
      if ((bVar9 & 1) != 0) {
        _Var7 = std::pow<int,int>(0,0x662306);
        pCVar3->on = (OBJ_DATA *)((long)_Var7 | (ulong)pCVar3->on);
      }
      if (((bVar9 & 1) != 0) || ((bVar8 & 1) != 0)) {
        _Var7 = std::pow<int,int>(0,0x662344);
        in_stack_ffffffffffffc9c0 = (OBJ_DATA *)(long)_Var7;
        (&pCVar3->was_in_room)[iVar10 / 0x20] =
             (ROOM_INDEX_DATA *)
             ((ulong)in_stack_ffffffffffffc9c0 | (ulong)(&pCVar3->was_in_room)[iVar10 / 0x20]);
        in_stack_ffffffffffffc9c8 = pCVar3;
      }
      if ((bVar8 & 1) != 0) {
        _Var7 = std::pow<int,int>(0,0x662399);
        pCVar3->was_in_room =
             (ROOM_INDEX_DATA *)(((long)_Var7 ^ 0xffffffffffffffffU) & (ulong)pCVar3->was_in_room);
      }
      free_pstring((char *)in_stack_ffffffffffffc9c0);
      pDVar4 = (DESCRIPTOR_DATA *)palloc_string(in_stack_ffffffffffffc9e8);
      pCVar3->desc = pDVar4;
      free_pstring((char *)in_stack_ffffffffffffc9c0);
      pAVar5 = (AFFECT_DATA *)palloc_string(in_stack_ffffffffffffc9e8);
      pCVar3->affected = pAVar5;
      obj_to_char(in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8);
      if ((bVar8 & 1) == 0) {
        if (*(char **)&pCVar3->timer != (char *)0x0) {
          free_pstring((char *)in_stack_ffffffffffffc9c0);
        }
        pcVar6 = palloc_string(in_stack_ffffffffffffc9e8);
        *(char **)&pCVar3->timer = pcVar6;
      }
      act((char *)CONCAT44(iVar10,CONCAT13(bVar9,CONCAT12(bVar8,in_stack_ffffffffffffc9d0))),
          in_stack_ffffffffffffc9c8,in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8,0);
    }
    else {
      show_flag_cmds(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8);
    }
  }
  return;
}

Assistant:

void do_createcosmetic(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], wlname[MSL], *wearname;
	OBJ_DATA *obj;
	int value = 0;
	bool under= false, wear= false;

	if (!strcmp(argument, ""))
	{
		send_to_char("createcosmetic 'wear location' <name>\n\r", ch);
		send_to_char("createcosmetic under <eq location> 'wear location' <name>\n\r", ch);
		send_to_char("createcosmetic eqlocations\n\r", ch);
		send_to_char("createcosmetic wear <eq location> <name>\n\r\n\r", ch);
		send_to_char("Example 1: createcosmetic 'on earlobe' a jewel-encrusted earring\n\rwould produce 'a "\
					 "jewel-encrusted earring' that's <worn on earlobe>\n\r", ch);
		send_to_char("Example 2: createcosmetic under arms 'as undershirt' a plain white t-shirt\n\rwould produce 'a "\
					 "plain white t-shirt' that's <worn as undershirt> and visible only when arms are not covered.\n\r", ch);
		send_to_char("Example 3: createcosmetic eqlocations will show all valid values for <eq location>\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	if (!str_cmp(arg1, "eqlocations"))
	{
		show_flag_cmds(ch, wear_flags);
		return;
	}
	else if (!str_cmp(arg1, "under"))
	{
		argument = one_argument(argument, arg2);
		argument = one_argument(argument, wlname);
		if (!str_cmp(arg2, "")
			|| !str_cmp(wlname, "")
			|| !str_cmp(argument, "")
			||  (value = flag_value(wear_flags, arg2)) == NO_FLAG)
		{
			send_to_char("Invalid arguments.\n\r", ch);
			return;
		}

		under = true;
	}
	else if (!str_cmp(arg1, "wear"))
	{
		argument = one_argument(argument, arg2);
		if (!str_cmp(arg2, "")
			|| !str_cmp(argument, "")
			|| (value = flag_value(wear_flags, arg2)) == NO_FLAG)
		{
			send_to_char("Invalid arguments.\n\r", ch);
			return;
		}

		wear = true;
	}
	else if (!wear && !under)
	{
		strcpy(&wlname[0], &arg1[0]);

		if (!str_cmp(argument, ""))
			return;
	}
	else
	{
		return;
	}

	obj = create_object(get_obj_index(40), 0);

	if (under)
		SET_BIT(obj->extra_flags, ITEM_UNDER_CLOTHES);

	if (under || wear)
		SET_BIT(obj->wear_flags, value);

	if (wear)
		REMOVE_BIT(obj->wear_flags, ITEM_WEAR_COSMETIC);

	free_pstring(obj->name);
	obj->name = palloc_string(argument);

	free_pstring(obj->short_descr);
	obj->short_descr = palloc_string(argument);

	obj_to_char(obj, ch);

	if (!wear)
	{
		if (obj->wear_loc_name)
			free_pstring(obj->wear_loc_name);

		obj->wear_loc_name = palloc_string(wlname);
	}

	act("You create $p.", ch, obj, 0, TO_CHAR);
}